

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_vine_swap.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
::_negative_positive_transpose
          (RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
           *this,Index columnIndex)

{
  Index IVar1;
  bool bVar2;
  Pos_index PVar3;
  Master_RU_matrix *pMVar4;
  mapped_type *pmVar5;
  Master_RU_matrix *pMVar6;
  Pos_index *pPVar7;
  mapped_type *__a;
  mapped_type *__b;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>,_bool>
  pVar8;
  key_type local_38;
  key_type local_34;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_30;
  undefined1 local_28;
  key_type local_1c;
  Pos_index local_18;
  Index local_14;
  RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
  *pRStack_10;
  Index columnIndex_local;
  RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
  *this_local;
  
  local_14 = columnIndex;
  pRStack_10 = this;
  pMVar4 = _matrix(this);
  local_18 = _get_birth(this,local_14);
  pmVar5 = std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::at(&pMVar4->pivotToColumnIndex_,&local_18);
  *pmVar5 = columnIndex + 1;
  bVar2 = _is_paired(this,local_14 + 1);
  if (bVar2) {
    pMVar4 = _matrix(this);
    pMVar6 = _matrix(this);
    local_1c = local_14 + 1;
    pmVar5 = std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::at(&pMVar6->pivotToColumnIndex_,&local_1c);
    pVar8 = std::
            unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
            ::emplace<unsigned_int&,unsigned_int&>
                      ((unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                        *)&pMVar4->pivotToColumnIndex_,&local_14,pmVar5);
    local_30._M_cur =
         (__node_type *)
         pVar8.first.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
         _M_cur;
    local_28 = pVar8.second;
    pMVar4 = _matrix(this);
    local_34 = local_14 + 1;
    std::
    unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::erase(&pMVar4->pivotToColumnIndex_,&local_34);
  }
  PVar3 = local_14 + 1;
  pPVar7 = _death(this,local_14);
  IVar1 = local_14;
  *pPVar7 = PVar3;
  pPVar7 = _birth(this,local_14 + 1);
  *pPVar7 = IVar1;
  __a = std::
        unordered_map<unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>_>
        ::at(&(this->super_type).indexToBar_,&local_14);
  local_38 = local_14 + 1;
  __b = std::
        unordered_map<unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>_>
        ::at(&(this->super_type).indexToBar_,&local_38);
  std::swap<std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
            (__a,__b);
  return;
}

Assistant:

inline void RU_vine_swap<Master_matrix>::_negative_positive_transpose(Index columnIndex) 
{
  _matrix()->pivotToColumnIndex_.at(_get_birth(columnIndex)) = columnIndex + 1;
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    if (_is_paired(columnIndex + 1)) {
      _matrix()->pivotToColumnIndex_.emplace(columnIndex, _matrix()->pivotToColumnIndex_.at(columnIndex + 1));
      _matrix()->pivotToColumnIndex_.erase(columnIndex + 1);
    }
  } else {
    _matrix()->pivotToColumnIndex_[columnIndex] = _matrix()->pivotToColumnIndex_[columnIndex + 1];
    _matrix()->pivotToColumnIndex_[columnIndex + 1] = Master_matrix::template get_null_value<Index>();
  }

  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    _death(columnIndex) = columnIndex + 1;
    _birth(columnIndex + 1) = columnIndex;
    std::swap(RUP::indexToBar_.at(columnIndex), RUP::indexToBar_.at(columnIndex + 1));
  }
}